

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O0

Constant * spvtools::opt::anon_unknown_0::GetInf(Type *type,ConstantManager *const_mgr)

{
  int iVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  float val;
  double val_00;
  Float *float_type;
  ConstantManager *const_mgr_local;
  Type *type_local;
  
  iVar1 = (*type->_vptr_Type[0xc])();
  if ((Float *)CONCAT44(extraout_var,iVar1) == (Float *)0x0) {
    type_local = (Type *)0x0;
  }
  else {
    uVar2 = analysis::Float::width((Float *)CONCAT44(extraout_var,iVar1));
    if (uVar2 == 0x20) {
      val = std::numeric_limits<float>::infinity();
      type_local = (Type *)analysis::ConstantManager::GetFloatConst(const_mgr,val);
    }
    else if (uVar2 == 0x40) {
      val_00 = std::numeric_limits<double>::infinity();
      type_local = (Type *)analysis::ConstantManager::GetDoubleConst(const_mgr,val_00);
    }
    else {
      type_local = (Type *)0x0;
    }
  }
  return (Constant *)type_local;
}

Assistant:

const analysis::Constant* GetInf(const analysis::Type* type,
                                 analysis::ConstantManager* const_mgr) {
  const analysis::Float* float_type = type->AsFloat();
  if (float_type == nullptr) {
    return nullptr;
  }

  switch (float_type->width()) {
    case 32:
      return const_mgr->GetFloatConst(std::numeric_limits<float>::infinity());
    case 64:
      return const_mgr->GetDoubleConst(std::numeric_limits<double>::infinity());
    default:
      return nullptr;
  }
}